

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetQuantity
          (FXBase *this,string *key,double qty)

{
  FX *pFVar1;
  double key_00;
  ostream *poVar2;
  InvalidSubjectException *this_00;
  string local_220;
  string local_200 [8];
  string qty_string;
  string local_1d8;
  int local_1b8;
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [376];
  double local_20;
  double qty_local;
  string *key_local;
  FXBase *this_local;
  
  local_20 = qty;
  qty_local = (double)key;
  key_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (local_20 <= 0.0) {
    poVar2 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
    local_1b8 = (int)std::setprecision(2);
    poVar2 = std::operator<<(poVar2,(_Setprecision)local_1b8);
    poVar2 = std::operator<<(poVar2,"dealt quantity must be a positive value: ");
    std::ostream::operator<<(poVar2,local_20);
    qty_string.field_2._M_local_buf[0xf] = '\x01';
    this_00 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    InvalidSubjectException::InvalidSubjectException(this_00,&local_1d8);
    qty_string.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(this_00,&InvalidSubjectException::typeinfo,
                InvalidSubjectException::~InvalidSubjectException);
  }
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  qty_string.field_2._8_4_ = std::setprecision(2);
  poVar2 = std::operator<<(poVar2,(_Setprecision)qty_string.field_2._8_4_);
  std::ostream::operator<<(poVar2,local_20);
  std::__cxx11::stringstream::str();
  key_00 = qty_local;
  pFVar1 = this->outer_class_;
  std::__cxx11::stringstream::str();
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,(string *)key_00,
             &local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetQuantity(const std::string& key, double qty)
{
    std::stringstream ss;

    if (qty <= 0)
    {
        ss << std::fixed << std::setprecision(2) << "dealt quantity must be a positive value: " << qty;
        throw InvalidSubjectException(ss.str());
    }

    ss << std::fixed << std::setprecision(2) << qty;

    std::string qty_string = ss.str();

    outer_class_.subject_builder_.SetComponent(key, ss.str());
}